

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.h
# Opt level: O2

void __thiscall
mp::
DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertWithConstResult
          (DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ItemType_conflict5 *dc)

{
  undefined8 uVar1;
  int res;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  allocator_type local_202;
  allocator_type local_201;
  _Vector_base<int,_std::allocator<int>_> local_200;
  _Vector_base<double,_std::allocator<double>_> local_1e8;
  undefined8 local_1d0;
  double local_1c8 [2];
  LinTerms lt;
  LinTerms local_140;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> local_c8;
  
  res = (dc->super_FunctionalConstraint).result_var_;
  local_1c8[0] = (((this->
                   super_BasicFuncConstrCvt<mp::DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   ).
                   super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  .mdl_cvt_)->
                 super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ).
                 super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[res];
  local_1c8[1] = -1.0;
  __l._M_len = 2;
  __l._M_array = local_1c8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1e8,__l,&local_201);
  uVar1 = *(undefined8 *)
           (dc->super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>).
           args_._M_elems;
  local_1d0 = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_1d0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_200,__l_00,&local_202);
  LinTerms::LinTerms(&lt,(vector<double,_std::allocator<double>_> *)&local_1e8,
                     (vector<int,_std::allocator<int>_> *)&local_200);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_200);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1e8);
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_BasicFuncConstrCvt<mp::DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  LinTerms::LinTerms(&local_140,&lt);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (&local_c8,&local_140,(AlgConRhs<0>)0x0,true);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>(this_00,&local_c8);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(&local_c8);
  LinTerms::~LinTerms(&local_140);
  EnsureDivisorNot0(this,res,(VarArray2)
                             *&(dc->
                               super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>
                               ).args_._M_elems);
  LinTerms::~LinTerms(&lt);
  return;
}

Assistant:

void ConvertWithConstResult(const ItemType& dc) {
    auto r = dc.GetResultVar();
    const auto& args = dc.GetArguments();
    /// r = arg0 / arg1,    arg0 = arg1 * r;
    auto lt = LinTerms{
        { GetMC().fixed_value(r), -1.0 },
        { args[1], args[0] }
    };
    GetMC().AddConstraint (LinConEQ( std::move(lt), { 0.0 } ) );
    EnsureDivisorNot0(r, args);
  }